

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_movrr(ASMState *as,IRIns *ir,Reg dst,Reg src)

{
  uint uVar1;
  
  if (dst < 0x10) {
    uVar1._0_2_ = *(IROpT *)((long)ir + 4);
    uVar1._2_2_ = *(IRRef1 *)((long)ir + 6);
    emit_rr(as,XO_MOV,-(uint)((0x605fd9U >> (uVar1 & 0x1f) & 1) != 0) & 0x80200 | dst,src);
    return;
  }
  emit_rr(as,XO_MOVAPS,dst,src);
  return;
}

Assistant:

static void emit_movrr(ASMState *as, IRIns *ir, Reg dst, Reg src)
{
  UNUSED(ir);
  if (dst < RID_MAX_GPR)
    emit_rr(as, XO_MOV, REX_64IR(ir, dst), src);
  else
    emit_rr(as, XO_MOVAPS, dst, src);
}